

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O1

bool Js::ScriptFunction::GetSymbolName(Var computedNameVar,char16 **symbolName,charcount_t *length)

{
  PropertyRecord *pPVar1;
  bool bVar2;
  JavascriptSymbol *pJVar3;
  uint uVar4;
  
  if (computedNameVar != (Var)0x0) {
    bVar2 = VarIs<Js::JavascriptSymbol>(computedNameVar);
    if (bVar2) {
      pJVar3 = VarTo<Js::JavascriptSymbol>(computedNameVar);
      pPVar1 = (pJVar3->propertyRecordUsageCache).propertyRecord.ptr;
      *symbolName = (char16 *)(pPVar1 + 1);
      uVar4 = pPVar1->byteCount >> 1;
      bVar2 = true;
      goto LAB_00d59bd4;
    }
  }
  *symbolName = (char16 *)0x0;
  uVar4 = 0;
  bVar2 = false;
LAB_00d59bd4:
  *length = uVar4;
  return bVar2;
}

Assistant:

bool ScriptFunction::GetSymbolName(Var computedNameVar, const char16** symbolName, charcount_t* length)
    {
        if (nullptr != computedNameVar && VarIs<JavascriptSymbol>(computedNameVar))
        {
            const PropertyRecord* symbolRecord = VarTo<JavascriptSymbol>(computedNameVar)->GetValue();
            *symbolName = symbolRecord->GetBuffer();
            *length = symbolRecord->GetLength();
            return true;
        }
        *symbolName = nullptr;
        *length = 0;
        return false;
    }